

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall
Image::drawOnto(Image *this,Image *image,Point point,
               vector<MaskRect,_std::allocator<MaskRect>_> *sections)

{
  bool bVar1;
  runtime_error *prVar2;
  Color *pCVar3;
  undefined8 in_RDX;
  int *in_RSI;
  int *in_RDI;
  int x;
  int y;
  MaskRect *section;
  iterator __end1;
  iterator __begin1;
  vector<MaskRect,_std::allocator<MaskRect>_> *__range1;
  Color *in_stack_fffffffffffffee8;
  Image *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint local_e4;
  uint in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 uVar4;
  _Alloc_hider in_stack_ffffffffffffff27;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string local_b8 [35];
  undefined1 local_95;
  string local_60 [32];
  reference local_40;
  MaskRect *local_38;
  __normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_> local_30 [3];
  int *local_18;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_8 = in_RDX;
  local_30[0]._M_current =
       (MaskRect *)
       std::vector<MaskRect,_std::allocator<MaskRect>_>::begin
                 ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffee8);
  local_38 = (MaskRect *)
             std::vector<MaskRect,_std::allocator<MaskRect>_>::end
                       ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffee8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1) {
      return;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
               operator*(local_30);
    if ((*in_RDI < (int)(uint)local_40->x2) || (in_RDI[1] < (int)(uint)local_40->y2)) break;
    if ((*local_18 < (int)((int)local_8 + (uint)local_40->x2)) ||
       (local_18[1] < (int)(local_8._4_4_ + (uint)local_40->y2))) {
      uVar4 = 1;
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffff27;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20))));
      std::operator+(__lhs,(char *)prVar2);
      std::runtime_error::runtime_error(prVar2,local_b8);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (in_stack_ffffffffffffff20 = (uint)local_40->y1;
        (int)in_stack_ffffffffffffff20 < (int)(uint)local_40->y2;
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1) {
      for (local_e4 = (uint)local_40->x1; (int)local_e4 < (int)(uint)local_40->x2;
          local_e4 = local_e4 + 1) {
        in_stack_fffffffffffffee8 =
             pixel(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                   (int)in_stack_fffffffffffffee8);
        pCVar3 = pixel(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                       (int)in_stack_fffffffffffffee8);
        *pCVar3 = *in_stack_fffffffffffffee8;
      }
    }
    __gnu_cxx::__normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
    operator++(local_30);
  }
  local_95 = 1;
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,
                               CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))));
  std::operator+(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
  std::runtime_error::runtime_error(prVar2,local_60);
  local_95 = 0;
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::drawOnto(Image &image, Point point, std::vector<MaskRect> sections) const {
	for (const auto& section : sections) {
		throwing_assert(section.x2 <= size.width && section.y2 <= size.height);
		throwing_assert(point.x + section.x2 <= image.size.width && point.y + section.y2 <= image.size.height);
		for (int y = section.y1; y < section.y2; y++) {
			for (int x = section.x1; x < section.x2; x++) {
				image.pixel(x + point.x, y + point.y) = this->pixel(x, y);
			}
		}
	}
}